

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

void __thiscall
Am_Text_Mark_Data::Am_Text_Mark_Data
          (Am_Text_Mark_Data *this,Am_Rich_Text *inText,Am_Text_Index inWhere,Am_Value *inMarkData,
          bool inStickyLeft,bool inDeleteable,bool inVisible)

{
  Am_Text_Fragment *pAVar1;
  Am_Value local_40;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eb2f8;
  Am_Style::Am_Style(&this->mStyle);
  (this->mData).type = 0;
  (this->mData).value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = Am_Rich_Text::Get_Fragment_At(inText,inWhere);
  this->mFragment = pAVar1;
  this->mIndex = inWhere;
  Am_Value::Am_Value(&local_40,inMarkData);
  Am_Value::operator=(&this->mData,&local_40);
  Am_Value::~Am_Value(&local_40);
  this->mFlags = this->mFlags | (ulong)inStickyLeft + (ulong)inDeleteable * 2 + (ulong)inVisible * 4
  ;
  return;
}

Assistant:

Am_Text_Mark_Data::Am_Text_Mark_Data(
    const Am_Rich_Text *inText,
    Am_Text_Index inWhere, // default: 0 => create at beginning
    Am_Value inMarkData,   // default: Am_No_Value
    bool inStickyLeft,     // default: true
    bool inDeleteable,     // default: true
    bool inVisible)        // default: false
{
  mFragment = inText->Get_Fragment_At(inWhere);
  mIndex = inWhere; // temp until above works
  Set_Data(inMarkData);
  Set_Sticky_Left(inStickyLeft);
  Set_Deleteable(inDeleteable);
  Set_Visible(inVisible);
  //  mFragment->Add_Mark( this );
}